

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall cmInstallExportGenerator::~cmInstallExportGenerator(cmInstallExportGenerator *this)

{
  ~cmInstallExportGenerator(this);
  operator_delete(this,0x178);
  return;
}

Assistant:

cmInstallExportGenerator::~cmInstallExportGenerator()
{
  delete this->EFGen;
}